

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

VariableData ** __thiscall
SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
          (SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this,InplaceStr *key)

{
  Node *pNVar1;
  bool bVar2;
  ulong uVar3;
  InplaceStr local_60;
  Node *local_50;
  Node *item;
  char *pcStack_40;
  uint i;
  char *local_38;
  InplaceStrHasher local_29;
  uint local_28;
  uint local_24;
  uint bucket;
  uint bucketMask;
  InplaceStr *key_local;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this_local;
  
  local_24 = this->bucketCount - 1;
  pcStack_40 = key->begin;
  local_38 = key->end;
  _bucket = key;
  key_local = (InplaceStr *)this;
  local_28 = InplaceStrHasher::operator()(&local_29,*key);
  local_28 = local_28 & local_24;
  item._4_4_ = 0;
  while( true ) {
    if (this->bucketCount <= item._4_4_) {
      return (VariableData **)0x0;
    }
    pNVar1 = this->data;
    uVar3 = (ulong)local_28;
    local_50 = pNVar1 + uVar3;
    InplaceStr::InplaceStr(&local_60);
    bVar2 = InplaceStr::operator==(&pNVar1[uVar3].key,&local_60);
    if (bVar2) break;
    bVar2 = InplaceStr::operator==(&local_50->key,_bucket);
    if (bVar2) {
      return &local_50->value;
    }
    local_28 = local_28 + item._4_4_ + 1 & local_24;
    item._4_4_ = item._4_4_ + 1;
  }
  return (VariableData **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}